

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall icu_63::StringTrieBuilder::ValueNode::operator==(ValueNode *this,Node *other)

{
  UBool UVar1;
  bool local_32;
  bool local_31;
  ValueNode *o;
  Node *other_local;
  ValueNode *this_local;
  
  if (this == (ValueNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = Node::operator==(&this->super_Node,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if (this->hasValue == *(char *)&other[1].super_UObject._vptr_UObject) {
        local_32 = true;
        if (this->hasValue != '\0') {
          local_32 = this->value == *(int *)((long)&other[1].super_UObject._vptr_UObject + 4);
        }
        local_31 = local_32;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::ValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const ValueNode &o=(const ValueNode &)other;
    return hasValue==o.hasValue && (!hasValue || value==o.value);
}